

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O1

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,NumeralExpression *expression)

{
  ExpressionWrapper *this_00;
  ConstExpression *this_01;
  
  this_00 = (ExpressionWrapper *)operator_new(0x10);
  this_01 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_01,expression->value_);
  IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)this_01);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(NumeralExpression* expression) {
  tos_value_ =
      new IRT::ExpressionWrapper(new IRT::ConstExpression(expression->value_));
}